

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O0

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel
          (FloatSampleProvider *source,ResamplerStage **resamplerStages,uint stageCount)

{
  CascadeStage *this;
  uint local_2c;
  CascadeStage *pCStack_28;
  uint i;
  FloatSampleProvider *prevStage;
  uint stageCount_local;
  ResamplerStage **resamplerStages_local;
  FloatSampleProvider *source_local;
  
  pCStack_28 = (CascadeStage *)source;
  for (local_2c = 0; local_2c < stageCount; local_2c = local_2c + 1) {
    this = (CascadeStage *)operator_new(0x8028);
    CascadeStage::CascadeStage
              (this,&pCStack_28->super_FloatSampleProvider,resamplerStages[local_2c]);
    pCStack_28 = this;
  }
  return &pCStack_28->super_FloatSampleProvider;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, ResamplerStage **resamplerStages, unsigned int stageCount) {
	FloatSampleProvider *prevStage = &source;
	for (unsigned int i = 0; i < stageCount; i++) {
		prevStage = new CascadeStage(*prevStage, *(resamplerStages[i]));
	}
	return *prevStage;
}